

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O3

void __thiscall AFastProjectile::Effect(AFastProjectile *this)

{
  double dVar1;
  _func_void_void_ptr *p_Var2;
  AActor *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClassActor *type;
  AActor *pAVar6;
  double dVar7;
  DVector3 local_28;
  
  pPVar5 = (this->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar4 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
    (this->super_AActor).super_DThinker.super_DObject.Class = pPVar5;
  }
  if (*(int *)&pPVar5[1].field_0xd4 == 0) {
    return;
  }
  dVar1 = (this->super_AActor).__Pos.Z;
  dVar7 = (this->super_AActor).floorz;
  p_Var2 = pPVar5[1].ConstructNative;
  local_28.X = (double)CONCAT44(local_28.X._4_4_,*(int *)&pPVar5[1].field_0xd4);
  pPVar5 = PClass::FindClass((FName *)&local_28);
  type = dyn_cast<PClassActor>((DObject *)pPVar5);
  if (type == (PClassActor *)0x0) {
    return;
  }
  dVar1 = dVar1 + -8.0;
  if (dVar7 <= dVar1) {
    dVar7 = dVar1;
  }
  local_28.Z = dVar7 + (double)p_Var2;
  local_28.X = (this->super_AActor).__Pos.X;
  local_28.Y = (this->super_AActor).__Pos.Y;
  pAVar6 = AActor::StaticSpawn(type,&local_28,ALLOW_REPLACE,false);
  if (pAVar6 == (AActor *)0x0) {
    return;
  }
  if ((((this->super_AActor).flags5.Value & 2) != 0) &&
     (pAVar3 = (this->super_AActor).target.field_0.p, pAVar3 != (AActor *)0x0)) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (pAVar6->target).field_0.p = pAVar3;
      goto LAB_0060b536;
    }
    (this->super_AActor).target.field_0.p = (AActor *)0x0;
  }
  (pAVar6->target).field_0.p = &this->super_AActor;
LAB_0060b536:
  (pAVar6->Angles).Pitch.Degrees = (this->super_AActor).Angles.Pitch.Degrees;
  (pAVar6->Angles).Yaw.Degrees = (this->super_AActor).Angles.Yaw.Degrees;
  return;
}

Assistant:

void AFastProjectile::Effect()
{
	FName name = GetClass()->MissileName;
	if (name != NAME_None)
	{
		double hitz = Z()-8;

		if (hitz < floorz)
		{
			hitz = floorz;
		}
		// Do not clip this offset to the floor.
		hitz += GetClass()->MissileHeight;
		
		PClassActor *trail = PClass::FindActor(name);
		if (trail != NULL)
		{
			AActor *act = Spawn (trail, PosAtZ(hitz), ALLOW_REPLACE);
			if (act != nullptr)
			{
				if ((flags5 & MF5_GETOWNER) && (target != nullptr))
					act->target = target;
				else
					act->target = this;
				
				act->Angles.Pitch = Angles.Pitch;
				act->Angles.Yaw = Angles.Yaw;
			}
		}
	}
}